

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t pick_interinter_wedge
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                  int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  undefined8 in_RCX;
  byte in_DL;
  int16_t *in_RSI;
  MACROBLOCK *in_RDI;
  uint8_t *in_R8;
  undefined7 unaff_retaddr;
  BLOCK_SIZE unaff_retaddr_00;
  MACROBLOCK *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int8_t wedge_sign;
  int8_t *in_stack_00000020;
  int8_t wedge_index;
  int64_t rd;
  int bw;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int16_t *in_stack_00008020;
  int16_t *in_stack_00008028;
  uint8_t *in_stack_00008030;
  BLOCK_SIZE in_stack_0000803f;
  MACROBLOCK *in_stack_00008040;
  AV1_COMP *in_stack_00008048;
  uint64_t *in_stack_ffffffffffffffa0;
  int8_t local_52;
  int8_t local_51;
  int64_t local_50;
  uint local_44;
  long local_40;
  int16_t *local_38;
  undefined7 in_stack_ffffffffffffffe8;
  
  local_38 = in_RSI + 0xd0;
  local_40 = **(long **)(in_RSI + 0x102c);
  local_44 = (uint)block_size_wide[in_DL];
  local_51 = -1;
  local_52 = '\0';
  if (in_RDI[2].best_pred_mv_sad[1] == 0) {
    local_50 = pick_wedge(in_stack_00008048,in_stack_00008040,in_stack_0000803f,in_stack_00008030,
                          in_stack_00008028,in_stack_00008020,&local_51,
                          (int8_t *)CONCAT44(in_stack_00000014,in_stack_00000010),
                          in_stack_ffffffffffffffa0);
  }
  else {
    local_52 = estimate_wedge_sign((AV1_COMP *)CONCAT17(unaff_retaddr_00,unaff_retaddr),in_RDI,
                                   (BLOCK_SIZE)((ulong)in_RSI >> 0x38),
                                   (uint8_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),
                                   (int)((ulong)in_RCX >> 0x20),in_R8,in_stack_00000010);
    local_50 = pick_wedge_fixed_sign
                         ((AV1_COMP *)CONCAT44(in_stack_00000014,in_stack_00000010),
                          in_stack_00000008,unaff_retaddr_00,(int16_t *)in_RDI,in_RSI,in_DL,
                          in_stack_00000020,(uint64_t *)rd);
  }
  *(int8_t *)(local_40 + 0x51) = local_52;
  *(int8_t *)(local_40 + 0x50) = local_51;
  return local_50;
}

Assistant:

static int64_t pick_interinter_wedge(
    const AV1_COMP *const cpi, MACROBLOCK *const x, const BLOCK_SIZE bsize,
    const uint8_t *const p0, const uint8_t *const p1,
    const int16_t *const residual1, const int16_t *const diff10,
    uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];

  int64_t rd;
  int8_t wedge_index = -1;
  int8_t wedge_sign = 0;

  assert(is_interinter_compound_used(COMPOUND_WEDGE, bsize));
  assert(cpi->common.seq_params->enable_masked_compound);

  if (cpi->sf.inter_sf.fast_wedge_sign_estimate) {
    wedge_sign = estimate_wedge_sign(cpi, x, bsize, p0, bw, p1, bw);
    rd = pick_wedge_fixed_sign(cpi, x, bsize, residual1, diff10, wedge_sign,
                               &wedge_index, best_sse);
  } else {
    rd = pick_wedge(cpi, x, bsize, p0, residual1, diff10, &wedge_sign,
                    &wedge_index, best_sse);
  }

  mbmi->interinter_comp.wedge_sign = wedge_sign;
  mbmi->interinter_comp.wedge_index = wedge_index;
  return rd;
}